

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O0

void __thiscall unixsocketipc::MessageReceiver::~MessageReceiver(MessageReceiver *this)

{
  char *__name;
  MessageReceiver *this_local;
  
  this->_vptr_MessageReceiver = (_func_int **)&PTR__MessageReceiver_00106da8;
  if (this->server_socket_fd != 0) {
    close(this->server_socket_fd);
  }
  __name = (char *)std::__cxx11::string::c_str();
  unlink(__name);
  if (this->message_buf != (char *)0x0) {
    operator_delete__(this->message_buf);
  }
  this->message_buf = (char *)0x0;
  std::__cxx11::string::~string((string *)&this->socket_filename);
  std::function<void_()>::~function(&this->on_client_connected);
  std::function<void_(unsigned_int,_const_char_*,_unsigned_int)>::~function(&this->callback);
  return;
}

Assistant:

MessageReceiver::~MessageReceiver() {
   // close the socket
   if (server_socket_fd)
      ::close(server_socket_fd);

   // remove socket file
   unlink(socket_filename.c_str());

   // get rid of the buffer
   delete[] message_buf;
   message_buf = nullptr;
}